

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

timespec fio_timer_calc_due(size_t interval)

{
  long lVar1;
  unsigned_long_long secs;
  size_t interval_local;
  timespec now;
  
  _interval_local = fio_last_tick();
  secs = interval;
  if (999 < interval) {
    interval_local = interval / 1000 + interval_local;
    secs = interval % 1000;
  }
  lVar1 = secs * 1000000 + now.tv_sec;
  now.tv_sec = lVar1;
  if (999999999 < lVar1) {
    now.tv_sec = lVar1 + -1000000000;
    interval_local = interval_local + 1;
  }
  return _interval_local;
}

Assistant:

static struct timespec fio_timer_calc_due(size_t interval) {
  struct timespec now = fio_last_tick();
  if (interval >= 1000) {
    unsigned long long secs = interval / 1000;
    now.tv_sec += secs;
    interval -= secs * 1000;
  }
  now.tv_nsec += (interval * 1000000UL);
  if (now.tv_nsec >= 1000000000L) {
    now.tv_nsec -= 1000000000L;
    now.tv_sec += 1;
  }
  return now;
}